

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O0

TString * internshrstr(lua_State *L,char *str,size_t l)

{
  global_State *pgVar1;
  uint h_00;
  int iVar2;
  stringtable *tb_00;
  TString *pTVar3;
  TString **local_50;
  TString **list;
  uint h;
  stringtable *tb;
  global_State *g;
  TString *ts;
  size_t l_local;
  char *str_local;
  lua_State *L_local;
  
  pgVar1 = L->l_G;
  tb_00 = &pgVar1->strt;
  h_00 = luaS_hash(str,l,pgVar1->seed);
  local_50 = tb_00->hash + (h_00 & (pgVar1->strt).size - 1U);
  g = (global_State *)*local_50;
  while( true ) {
    if (g == (global_State *)0x0) {
      if ((pgVar1->strt).size <= (pgVar1->strt).nuse) {
        growstrtab(L,tb_00);
        local_50 = tb_00->hash + (h_00 & (pgVar1->strt).size - 1U);
      }
      pTVar3 = createstrobj(L,l + 0x19,'\x04',h_00);
      pTVar3->shrlen = (ls_byte)l;
      *(undefined1 *)((long)&pTVar3->contents + l) = 0;
      memcpy(&pTVar3->contents,str,l);
      (pTVar3->u).hnext = *local_50;
      *local_50 = pTVar3;
      (pgVar1->strt).nuse = (pgVar1->strt).nuse + 1;
      return pTVar3;
    }
    if ((l == (uint)(int)*(char *)((long)&g->ud + 3)) &&
       (iVar2 = memcmp(str,&g->GCdebt,l), iVar2 == 0)) break;
    g = (global_State *)g->GCtotalbytes;
  }
  if ((*(byte *)((long)&g->ud + 1) & (pgVar1->currentwhite ^ 0x18)) != 0) {
    *(byte *)((long)&g->ud + 1) = *(byte *)((long)&g->ud + 1) ^ 0x18;
  }
  return (TString *)g;
}

Assistant:

static TString *internshrstr (lua_State *L, const char *str, size_t l) {
  TString *ts;
  global_State *g = G(L);
  stringtable *tb = &g->strt;
  unsigned int h = luaS_hash(str, l, g->seed);
  TString **list = &tb->hash[lmod(h, tb->size)];
  lua_assert(str != NULL);  /* otherwise 'memcmp'/'memcpy' are undefined */
  for (ts = *list; ts != NULL; ts = ts->u.hnext) {
    if (l == cast_uint(ts->shrlen) &&
        (memcmp(str, getshrstr(ts), l * sizeof(char)) == 0)) {
      /* found! */
      if (isdead(g, ts))  /* dead (but not collected yet)? */
        changewhite(ts);  /* resurrect it */
      return ts;
    }
  }
  /* else must create a new string */
  if (tb->nuse >= tb->size) {  /* need to grow string table? */
    growstrtab(L, tb);
    list = &tb->hash[lmod(h, tb->size)];  /* rehash with new size */
  }
  ts = createstrobj(L, sizestrshr(l), LUA_VSHRSTR, h);
  ts->shrlen = cast(ls_byte, l);
  getshrstr(ts)[l] = '\0';  /* ending 0 */
  memcpy(getshrstr(ts), str, l * sizeof(char));
  ts->u.hnext = *list;
  *list = ts;
  tb->nuse++;
  return ts;
}